

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicate_groups.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RemoveDuplicateGroups::VisitReplace
          (RemoveDuplicateGroups *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  iterator __position;
  vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
  *this_00;
  reference_wrapper<duckdb::BoundColumnRefExpression> local_18;
  
  this_00 = (vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
             *)::std::__detail::
               _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(expr->super_Expression).super_BaseExpression.type,
                            (key_type *)(expr_ptr + 0xb));
  __position._M_current = *(reference_wrapper<duckdb::BoundColumnRefExpression> **)(this_00 + 8);
  if (__position._M_current ==
      *(reference_wrapper<duckdb::BoundColumnRefExpression> **)(this_00 + 0x10)) {
    local_18._M_data = (BoundColumnRefExpression *)expr_ptr;
    ::std::
    vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundColumnRefExpression>>
              (this_00,__position,&local_18);
  }
  else {
    (__position._M_current)->_M_data = (BoundColumnRefExpression *)expr_ptr;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RemoveDuplicateGroups::VisitReplace(BoundColumnRefExpression &expr,
                                                           unique_ptr<Expression> *expr_ptr) {
	// add a column reference
	column_references[expr.binding].push_back(expr);
	return nullptr;
}